

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double folded_normal_mean(double a,double b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double r8_pi;
  double mean;
  double cdf;
  double a2;
  double b_local;
  double a_local;
  
  dVar1 = a / b;
  dVar2 = normal_01_cdf(dVar1);
  dVar3 = sqrt(0.6366197723675814);
  dVar1 = exp(dVar1 * -0.5 * dVar1);
  return b * dVar3 * dVar1 + -(a * (1.0 - (dVar2 + dVar2)));
}

Assistant:

double folded_normal_mean ( double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    FOLDED_NORMAL_MEAN returns the mean of the Folded Normal PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 <= A,
//    0.0 < B.
//
//    Output, double FOLDED_NORMAL_MEAN, the mean of the PDF.
//
{
  double a2;
  double cdf;
  double mean;
  const double r8_pi = 3.14159265358979323;

  a2 = a / b;

  cdf = normal_01_cdf ( a2 );

  mean = b * sqrt ( 2.0 / r8_pi ) * exp ( - 0.5 * a2 * a2 )
    - a * ( 1.0 - 2.0 * cdf );

  return mean;
}